

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.hpp
# Opt level: O2

void __thiscall trng::mrg3s::step(mrg3s *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  
  iVar1 = (this->P).a[0];
  iVar2 = (this->S).r[0];
  iVar3 = (this->P).a[1];
  iVar4 = (this->S).r[1];
  iVar5 = (this->P).a[2];
  iVar6 = (this->S).r[2];
  (this->S).r[2] = iVar4;
  (this->S).r[1] = iVar2;
  iVar7 = int_math::modulo_helper<2147462579,_1>::modulo
                    ((long)iVar6 * (long)iVar5 +
                     (long)iVar3 * (long)iVar4 + (long)iVar1 * (long)iVar2);
  (this->S).r[0] = iVar7;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg3s::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2])};
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 3>(t);
  }